

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoffscreenintegration_x11.cpp
# Opt level: O3

void __thiscall QOffscreenX11GLXContext::~QOffscreenX11GLXContext(QOffscreenX11GLXContext *this)

{
  QOffscreenX11GLXContextData *pQVar1;
  
  *(undefined ***)this = &PTR__QOffscreenX11GLXContext_0011c5c0;
  *(undefined ***)&this->super_QGLXContext = &PTR__QOffscreenX11GLXContext_0011c640;
  pQVar1 = (this->d).d;
  glXDestroyContext(pQVar1->x11->m_connection->m_display,pQVar1->context);
  pQVar1 = (this->d).d;
  XDestroyWindow(pQVar1->x11->m_connection->m_display,pQVar1->window);
  pQVar1 = (this->d).d;
  if (pQVar1 != (QOffscreenX11GLXContextData *)0x0) {
    QSurfaceFormat::~QSurfaceFormat(&pQVar1->format);
  }
  operator_delete(pQVar1,0x30);
  QNativeInterface::QGLXContext::~QGLXContext(&this->super_QGLXContext);
  QPlatformOpenGLContext::~QPlatformOpenGLContext(&this->super_QPlatformOpenGLContext);
  return;
}

Assistant:

QOffscreenX11GLXContext::~QOffscreenX11GLXContext()
{
    glXDestroyContext(d->x11->display(), d->context);
    XDestroyWindow(d->x11->display(), d->window);
}